

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestXmlElementHandler.cpp
# Opt level: O2

bool __thiscall
TestXmlElementHandler::paragraphMargin
          (TestXmlElementHandler *this,qreal *left,qreal *top,qreal *right,qreal *bottom,
          QDomElement *xmlElement)

{
  bool bVar1;
  QArrayDataPointer<char16_t> QStack_28;
  
  QDomElement::tagName();
  bVar1 = QString::operator==((QString *)&QStack_28,"paragraph-margins");
  if (bVar1) {
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&QStack_28);
    QString::QString((QString *)&QStack_28,"paragraph-margins");
    QList<QString>::emplaceBack<QString>(&this->cb,(QString *)&QStack_28);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&QStack_28);
    return true;
  }
  qt_assert("xmlElement.tagName() == \"paragraph-margins\"",
            "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/XmlParser/TestXmlElementHandler.cpp"
            ,0xd8);
}

Assistant:

bool TestXmlElementHandler::paragraphMargin(qreal &left, qreal &top, qreal &right, qreal &bottom, const QDomElement &xmlElement)
{
    Q_UNUSED(left);
    Q_UNUSED(top);
    Q_UNUSED(right);
    Q_UNUSED(bottom);
    Q_UNUSED(xmlElement); // unused in release mode
    Q_ASSERT(xmlElement.tagName() == "paragraph-margins");
    cb << "paragraph-margins";
    return true;
}